

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

ServiceOptions * __thiscall
google::protobuf::ServiceOptions::operator=(ServiceOptions *this,ServiceOptions *from)

{
  bool bVar1;
  Arena *lhs;
  Arena *rhs;
  ServiceOptions *from_local;
  ServiceOptions *this_local;
  
  if (this != from) {
    lhs = MessageLite::GetArena((MessageLite *)this);
    rhs = MessageLite::GetArena((MessageLite *)from);
    bVar1 = internal::CanMoveWithInternalSwap(lhs,rhs);
    if (bVar1) {
      InternalSwap(this,from);
    }
    else {
      CopyFrom(this,from);
    }
  }
  return this;
}

Assistant:

inline ServiceOptions& operator=(ServiceOptions&& from) noexcept {
    if (this == &from) return *this;
    if (::google::protobuf::internal::CanMoveWithInternalSwap(GetArena(), from.GetArena())) {
      InternalSwap(&from);
    } else {
      CopyFrom(from);
    }
    return *this;
  }